

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_getfield(lua_State *L,int idx,char *k)

{
  int iVar1;
  TValue *t;
  
  t = index2value(L,idx);
  iVar1 = auxgetstr(L,t,k);
  return iVar1;
}

Assistant:

LUA_API int lua_getfield (lua_State *L, int idx, const char *k) {
  lua_lock(L);
  return auxgetstr(L, index2value(L, idx), k);
}